

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

bool __thiscall hwnet::Epoll::Init(Epoll *this)

{
  int iVar1;
  epoll_event *peVar2;
  Epoll *this_local;
  
  iVar1 = epoll_create1(0x80000);
  this->epfd = iVar1;
  if (this->epfd < 0) {
    this_local._7_1_ = false;
  }
  else {
    this->maxevents = 0x40;
    peVar2 = (epoll_event *)calloc(1,(long)this->maxevents * 0xc);
    this->events = peVar2;
    if (this->events == (epoll_event *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Epoll::Init() {

	epfd  = epoll_create1(EPOLL_CLOEXEC);
	if(epfd < 0) {
		return false;
	}

	maxevents = 64;
	events = (epoll_event*)calloc(1,(sizeof(*this->events)*this->maxevents));
	if(!events) {
		return false;
	}	

	return true;
}